

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

void __thiscall
cmCommandArgumentParserHelper::AllocateParserType
          (cmCommandArgumentParserHelper *this,ParserType *pt,char *str,int len)

{
  pointer *pppcVar1;
  iterator __position;
  size_t sVar2;
  char *__dest;
  
  pt->str = (char *)0x0;
  if (len == 0) {
    sVar2 = strlen(str);
    len = (int)sVar2;
    if (len == 0) {
      return;
    }
  }
  __dest = (char *)operator_new__((long)(len + 1));
  pt->str = __dest;
  strncpy(__dest,str,(long)len);
  __dest[len] = '\0';
  __position._M_current =
       (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    *__position._M_current = __dest;
    pppcVar1 = &(this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
    return;
  }
  std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
            ((vector<char*,std::allocator<char*>> *)&this->Variables,__position,&pt->str);
  return;
}

Assistant:

void cmCommandArgumentParserHelper::AllocateParserType
(cmCommandArgumentParserHelper::ParserType* pt,const char* str, int len)
{
  pt->str = 0;
  if ( len == 0 )
    {
    len = static_cast<int>(strlen(str));
    }
  if ( len == 0 )
    {
    return;
    }
  pt->str = new char[ len + 1 ];
  strncpy(pt->str, str, len);
  pt->str[len] = 0;
  this->Variables.push_back(pt->str);
}